

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_10x10(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z5;
  JLONG z4;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp24;
  JLONG tmp23;
  JLONG tmp22;
  JLONG tmp21;
  JLONG tmp20;
  JLONG tmp14;
  JLONG tmp13;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  int local_218 [16];
  int local_1d8 [8];
  int local_1b8 [8];
  int local_198 [8];
  int local_178 [8];
  int local_158 [8];
  int local_138 [8];
  int local_118 [8];
  int local_f8 [11];
  int local_cc;
  long local_c8;
  int *local_b8;
  short *local_b0;
  short *local_a8;
  long local_78;
  long local_70;
  int local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  int local_40;
  long local_38;
  long local_30;
  uint local_24;
  long local_20;
  
  local_c8 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_b0 = *(short **)(in_RSI + 0x58);
  local_b8 = local_218;
  local_a8 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (local_cc = 0; local_cc < 8; local_cc = local_cc + 1) {
    lVar1 = (long)((int)*local_a8 * (int)*local_b0) * 0x2000 + 0x400;
    lVar2 = (long)((int)local_a8[0x20] * (int)local_b0[0x20]);
    local_78 = lVar1 + lVar2 * 0x249d;
    local_70 = lVar1 + lVar2 * -0xdfc;
    local_68 = (int)(lVar1 + lVar2 * -0x2d42 >> 0xb);
    lVar2 = ((long)((int)local_a8[0x10] * (int)local_b0[0x10]) +
            (long)((int)local_a8[0x30] * (int)local_b0[0x30])) * 0x1a9a;
    lVar1 = lVar2 + (long)((int)local_a8[0x10] * (int)local_b0[0x10]) * 0x1071;
    lVar2 = lVar2 + (long)((int)local_a8[0x30] * (int)local_b0[0x30]) * -0x45a4;
    local_58 = local_78 + lVar1;
    local_78 = local_78 - lVar1;
    local_60 = local_70 + lVar2;
    local_70 = local_70 - lVar2;
    lVar1 = (long)((int)local_a8[8] * (int)local_b0[8]);
    lVar2 = (long)((int)local_a8[0x18] * (int)local_b0[0x18]) +
            (long)((int)local_a8[0x38] * (int)local_b0[0x38]);
    lVar3 = (long)((int)local_a8[0x18] * (int)local_b0[0x18]) -
            (long)((int)local_a8[0x38] * (int)local_b0[0x38]);
    lVar4 = (long)((int)local_a8[0x28] * (int)local_b0[0x28]) * 0x2000;
    local_50 = lVar4 + lVar3 * 0x9e3;
    local_30 = lVar1 * 0x2cb3 + lVar2 * 0x1e6f + local_50;
    local_50 = lVar1 * 0x714 + lVar2 * -0x1e6f + local_50;
    local_48 = lVar4 + lVar3 * -0x9e3 + lVar3 * -0x1000;
    local_40 = (((int)local_a8[8] * (int)local_b0[8] - (int)lVar3) -
               (int)local_a8[0x28] * (int)local_b0[0x28]) * 4;
    local_38 = (lVar1 * 0x2853 + lVar2 * -0x12cf) - local_48;
    local_48 = lVar1 * 0x148c + lVar2 * -0x12cf + local_48;
    *local_b8 = (int)(local_58 + local_30 >> 0xb);
    local_b8[0x48] = (int)(local_58 - local_30 >> 0xb);
    local_b8[8] = (int)(local_60 + local_38 >> 0xb);
    local_b8[0x40] = (int)(local_60 - local_38 >> 0xb);
    local_b8[0x10] = local_68 + local_40;
    local_b8[0x38] = local_68 - local_40;
    local_b8[0x18] = (int)(local_70 + local_48 >> 0xb);
    local_b8[0x30] = (int)(local_70 - local_48 >> 0xb);
    local_b8[0x20] = (int)(local_78 + local_50 >> 0xb);
    local_b8[0x28] = (int)(local_78 - local_50 >> 0xb);
    local_a8 = local_a8 + 1;
    local_b0 = local_b0 + 1;
    local_b8 = local_b8 + 1;
  }
  local_b8 = local_218;
  for (local_cc = 0; local_cc < 10; local_cc = local_cc + 1) {
    puVar5 = (undefined1 *)(*(long *)(local_20 + (long)local_cc * 8) + (ulong)local_24);
    lVar2 = ((long)*local_b8 + 0x10) * 0x2000;
    lVar1 = (long)local_b8[4];
    lVar6 = lVar2 + lVar1 * 0x249d;
    lVar7 = lVar2 + lVar1 * -0xdfc;
    lVar2 = lVar2 + lVar1 * -0x2d42;
    lVar3 = ((long)local_b8[2] + (long)local_b8[6]) * 0x1a9a;
    lVar1 = lVar3 + (long)local_b8[2] * 0x1071;
    lVar3 = lVar3 + (long)local_b8[6] * -0x45a4;
    lVar4 = lVar6 + lVar1;
    lVar6 = lVar6 - lVar1;
    lVar1 = lVar7 + lVar3;
    lVar7 = lVar7 - lVar3;
    lVar3 = (long)local_b8[1];
    lVar8 = (long)local_b8[5] * 0x2000;
    lVar9 = (long)local_b8[3] + (long)local_b8[7];
    lVar10 = (long)local_b8[3] - (long)local_b8[7];
    lVar11 = lVar8 + lVar10 * 0x9e3;
    lVar12 = lVar3 * 0x2cb3 + lVar9 * 0x1e6f + lVar11;
    lVar11 = lVar3 * 0x714 + lVar9 * -0x1e6f + lVar11;
    lVar13 = lVar8 + lVar10 * -0x9e3 + lVar10 * -0x1000;
    lVar8 = (lVar3 - lVar10) * 0x2000 + (long)local_b8[5] * -0x2000;
    lVar10 = (lVar3 * 0x2853 + lVar9 * -0x12cf) - lVar13;
    lVar13 = lVar3 * 0x148c + lVar9 * -0x12cf + lVar13;
    *puVar5 = *(undefined1 *)(local_c8 + (int)((uint)(lVar4 + lVar12 >> 0x12) & 0x3ff));
    puVar5[9] = *(undefined1 *)(local_c8 + (int)((uint)(lVar4 - lVar12 >> 0x12) & 0x3ff));
    puVar5[1] = *(undefined1 *)(local_c8 + (int)((uint)(lVar1 + lVar10 >> 0x12) & 0x3ff));
    puVar5[8] = *(undefined1 *)(local_c8 + (int)((uint)(lVar1 - lVar10 >> 0x12) & 0x3ff));
    puVar5[2] = *(undefined1 *)(local_c8 + (int)((uint)(lVar2 + lVar8 >> 0x12) & 0x3ff));
    puVar5[7] = *(undefined1 *)(local_c8 + (int)((uint)(lVar2 - lVar8 >> 0x12) & 0x3ff));
    puVar5[3] = *(undefined1 *)(local_c8 + (int)((uint)(lVar7 + lVar13 >> 0x12) & 0x3ff));
    puVar5[6] = *(undefined1 *)(local_c8 + (int)((uint)(lVar7 - lVar13 >> 0x12) & 0x3ff));
    puVar5[4] = *(undefined1 *)(local_c8 + (int)((uint)(lVar6 + lVar11 >> 0x12) & 0x3ff));
    puVar5[5] = *(undefined1 *)(local_c8 + (int)((uint)(lVar6 - lVar11 >> 0x12) & 0x3ff));
    local_b8 = local_b8 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_10x10(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24;
  JLONG z1, z2, z3, z4, z5;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 10];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z3 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z3 += ONE << (CONST_BITS - PASS1_BITS - 1);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z1 = MULTIPLY(z4, FIX(1.144122806));         /* c4 */
    z2 = MULTIPLY(z4, FIX(0.437016024));         /* c8 */
    tmp10 = z3 + z1;
    tmp11 = z3 - z2;

    tmp22 = RIGHT_SHIFT(z3 - LEFT_SHIFT(z1 - z2, 1),
                        CONST_BITS - PASS1_BITS); /* c0 = (c4-c8)*2 */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));    /* c6 */
    tmp12 = z1 + MULTIPLY(z2, FIX(0.513743148)); /* c2-c6 */
    tmp13 = z1 - MULTIPLY(z3, FIX(2.176250899)); /* c2+c6 */

    tmp20 = tmp10 + tmp12;
    tmp24 = tmp10 - tmp12;
    tmp21 = tmp11 + tmp13;
    tmp23 = tmp11 - tmp13;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = z2 + z4;
    tmp13 = z2 - z4;

    tmp12 = MULTIPLY(tmp13, FIX(0.309016994));        /* (c3-c7)/2 */
    z5 = LEFT_SHIFT(z3, CONST_BITS);

    z2 = MULTIPLY(tmp11, FIX(0.951056516));           /* (c3+c7)/2 */
    z4 = z5 + tmp12;

    tmp10 = MULTIPLY(z1, FIX(1.396802247)) + z2 + z4; /* c1 */
    tmp14 = MULTIPLY(z1, FIX(0.221231742)) - z2 + z4; /* c9 */

    z2 = MULTIPLY(tmp11, FIX(0.587785252));           /* (c1-c9)/2 */
    z4 = z5 - tmp12 - LEFT_SHIFT(tmp13, CONST_BITS - 1);

    tmp12 = LEFT_SHIFT(z1 - tmp13 - z3, PASS1_BITS);

    tmp11 = MULTIPLY(z1, FIX(1.260073511)) - z2 - z4; /* c3 */
    tmp13 = MULTIPLY(z1, FIX(0.642039522)) - z2 + z4; /* c7 */

    /* Final output stage */

    wsptr[8 * 0] = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1] = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2] = (int)(tmp22 + tmp12);
    wsptr[8 * 7] = (int)(tmp22 - tmp12);
    wsptr[8 * 3] = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6] = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4] = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5] = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 10 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 10; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z3 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    z4 = (JLONG)wsptr[4];
    z1 = MULTIPLY(z4, FIX(1.144122806));         /* c4 */
    z2 = MULTIPLY(z4, FIX(0.437016024));         /* c8 */
    tmp10 = z3 + z1;
    tmp11 = z3 - z2;

    tmp22 = z3 - LEFT_SHIFT(z1 - z2, 1);         /* c0 = (c4-c8)*2 */

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));    /* c6 */
    tmp12 = z1 + MULTIPLY(z2, FIX(0.513743148)); /* c2-c6 */
    tmp13 = z1 - MULTIPLY(z3, FIX(2.176250899)); /* c2+c6 */

    tmp20 = tmp10 + tmp12;
    tmp24 = tmp10 - tmp12;
    tmp21 = tmp11 + tmp13;
    tmp23 = tmp11 - tmp13;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    z4 = (JLONG)wsptr[7];

    tmp11 = z2 + z4;
    tmp13 = z2 - z4;

    tmp12 = MULTIPLY(tmp13, FIX(0.309016994));        /* (c3-c7)/2 */

    z2 = MULTIPLY(tmp11, FIX(0.951056516));           /* (c3+c7)/2 */
    z4 = z3 + tmp12;

    tmp10 = MULTIPLY(z1, FIX(1.396802247)) + z2 + z4; /* c1 */
    tmp14 = MULTIPLY(z1, FIX(0.221231742)) - z2 + z4; /* c9 */

    z2 = MULTIPLY(tmp11, FIX(0.587785252));           /* (c1-c9)/2 */
    z4 = z3 - tmp12 - LEFT_SHIFT(tmp13, CONST_BITS - 1);

    tmp12 = LEFT_SHIFT(z1 - tmp13, CONST_BITS) - z3;

    tmp11 = MULTIPLY(z1, FIX(1.260073511)) - z2 - z4; /* c3 */
    tmp13 = MULTIPLY(z1, FIX(0.642039522)) - z2 + z4; /* c7 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[9] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[8] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[7] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}